

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O1

void __thiscall
inja::RenderError::RenderError(RenderError *this,string *message,SourceLocation location)

{
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"render_error","");
  InjaError::InjaError(&this->super_InjaError,&local_50,message,location);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&this->super_InjaError = &PTR__InjaError_001b1460;
  return;
}

Assistant:

explicit RenderError(const std::string& message, SourceLocation location): InjaError("render_error", message, location) {}